

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O3

void __thiscall
wasm::CoalesceLocals::pickIndices
          (CoalesceLocals *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  Index IVar1;
  uint uVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  size_t sVar7;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __result;
  ulong uVar8;
  uint *puVar9;
  uint *puVar10;
  ulong uVar11;
  uint *puVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjustedTotalCopies;
  Index removedCopies;
  Index reverseRemovedCopies;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ret;
  undefined1 local_48 [16];
  pointer local_38;
  
  IVar1 = (this->
          super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
          ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
          numLocals;
  if (IVar1 != 0) {
    if (IVar1 == 1) {
      local_88._0_4_ = 0;
      __position._M_current =
           (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (indices,__position,(uint *)local_88);
      }
      else {
        *__position._M_current = 0;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                 &(this->
                  super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                  .totalCopies);
      sVar7 = Function::getNumParams
                        ((this->
                         super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                         ).
                         super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                         .
                         super_ControlFlowWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .
                         super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .currFunction);
      if (sVar7 != 0) {
        uVar8 = 0;
        do {
          *(undefined4 *)(CONCAT44(local_88._4_4_,local_88._0_4_) + uVar8 * 4) = 0xffffffff;
          uVar8 = uVar8 + 1;
        } while ((uVar8 & 0xffffffff) < sVar7);
      }
      uVar8 = (ulong)(this->
                     super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                     ).
                     super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                     .numLocals;
      _removedCopies = (undefined1  [16])0x0;
      ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,uVar8);
      auVar6 = _DAT_00b585e0;
      if (uVar8 != 0) {
        lVar16 = uVar8 - 1;
        auVar18._8_4_ = (int)lVar16;
        auVar18._0_8_ = lVar16;
        auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar11 = 0;
        auVar18 = auVar18 ^ _DAT_00b585e0;
        auVar19 = _DAT_00b585d0;
        do {
          auVar20 = auVar19 ^ auVar6;
          if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                      auVar18._4_4_ < auVar20._4_4_) & 1)) {
            _removedCopies[uVar11] = (uint)uVar11;
          }
          if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
              auVar20._12_4_ <= auVar18._12_4_) {
            _removedCopies[uVar11 + 1] = (uint)uVar11 + 1;
          }
          uVar11 = uVar11 + 2;
          lVar16 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 2;
          auVar19._8_8_ = lVar16 + 2;
        } while ((uVar8 + 1 & 0xfffffffffffffffe) != uVar11);
      }
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      puVar4 = ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = _removedCopies;
      _removedCopies = (pointer)local_48._0_8_;
      ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_48._8_8_;
      ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = local_38;
      local_48 = (undefined1  [16])0x0;
      local_38 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3,(long)puVar4 - (long)puVar3);
        if ((pointer)local_48._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
        }
      }
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,indices,
                 (Index *)&adjustedTotalCopies.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      puVar9 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar10 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      puVar12 = puVar9 + 1;
      if (puVar12 != puVar10 && puVar9 != puVar10) {
        uVar13 = *puVar9;
        do {
          uVar15 = *puVar12;
          bVar17 = uVar13 < uVar15;
          if (uVar13 <= uVar15) {
            uVar13 = uVar15;
          }
          if (bVar17) {
            puVar9 = puVar12;
          }
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar10);
      }
      if ((long)ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start - (long)_removedCopies == 0) {
        __assert_fail("num > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/permutations.h"
                      ,0x25,"void wasm::setIdentity(std::vector<Index> &)");
      }
      uVar13 = *puVar9;
      uVar8 = 0;
      do {
        _removedCopies[uVar8] = (uint)uVar8;
        uVar8 = uVar8 + 1;
      } while ((uVar8 & 0xffffffff) <
               (ulong)((long)ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)_removedCopies >> 2));
      uVar15 = (this->
               super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
               ).
               super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
               .numLocals;
      uVar8 = (ulong)uVar15;
      if ((uint)sVar7 < uVar15) {
        uVar11 = sVar7 & 0xffffffff;
        iVar14 = -1;
        do {
          _removedCopies[uVar11] = (int)uVar8 + iVar14;
          uVar11 = uVar11 + 1;
          uVar8 = (ulong)(this->
                         super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                         ).
                         super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                         .numLocals;
          iVar14 = iVar14 + -1;
        } while (uVar11 < uVar8);
      }
      adjustOrderByPriorities
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      puVar4 = ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = _removedCopies;
      _removedCopies = local_48;
      ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = local_38;
      local_48 = (undefined1  [16])0x0;
      local_38 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3,(long)puVar4 - (long)puVar3);
        if ((pointer)local_48._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
        }
      }
      local_48 = (undefined1  [16])0x0;
      local_38 = (pointer)0x0;
      pickIndicesFromOrder
                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&removedCopies,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                 (Index *)((long)&adjustedTotalCopies.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      puVar10 = (uint *)(local_48._0_8_ + 4);
      puVar9 = (uint *)local_48._0_8_;
      if (puVar10 != (uint *)local_48._8_8_ && local_48._0_8_ != local_48._8_8_) {
        uVar15 = *(uint *)local_48._0_8_;
        do {
          uVar2 = *puVar10;
          bVar17 = uVar15 < uVar2;
          if (uVar15 <= uVar2) {
            uVar15 = uVar2;
          }
          if (bVar17) {
            puVar9 = puVar10;
          }
          puVar10 = puVar10 + 1;
        } while (puVar10 != (uint *)local_48._8_8_);
      }
      if (((uint)adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage <
           adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) ||
         ((puVar10 = (uint *)local_48._0_8_,
          adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ ==
          (uint)adjustedTotalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage && (*puVar9 < uVar13)))) {
        puVar10 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
        puVar3 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar4 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
        (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_38;
        local_48._8_8_ = puVar3;
        local_48._0_8_ = puVar10;
        local_38 = puVar4;
      }
      if (puVar10 != (uint *)0x0) {
        operator_delete(puVar10,(long)local_38 - (long)puVar10);
      }
      if (_removedCopies != (pointer)0x0) {
        operator_delete(_removedCopies,
                        (long)ret.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)_removedCopies);
      }
      pvVar5 = (void *)CONCAT44(local_88._4_4_,local_88._0_4_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)adjustedTotalCopies.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5);
      }
    }
  }
  return;
}

Assistant:

void CoalesceLocals::pickIndices(std::vector<Index>& indices) {
  if (numLocals == 0) {
    return;
  }
  if (numLocals == 1) {
    indices.push_back(0);
    return;
  }
  // take into account total copies. but we must keep params in place, so give
  // them max priority
  auto adjustedTotalCopies = totalCopies;
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    adjustedTotalCopies[i] = std::numeric_limits<Index>::max();
  }
  // first try the natural order. this is less arbitrary than it seems, as the
  // program may have a natural order of locals inherent in it.
  auto order = makeIdentity(numLocals);
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  Index removedCopies;
  pickIndicesFromOrder(order, indices, removedCopies);
  auto maxIndex = *std::max_element(indices.begin(), indices.end());
  // next try the reverse order. this both gives us another chance at something
  // good, and also the very naturalness of the simple order may be quite
  // suboptimal
  setIdentity(order);
  for (Index i = numParams; i < numLocals; i++) {
    order[i] = numParams + numLocals - 1 - i;
  }
  order = adjustOrderByPriorities(order, adjustedTotalCopies);
  std::vector<Index> reverseIndices;
  Index reverseRemovedCopies;
  pickIndicesFromOrder(order, reverseIndices, reverseRemovedCopies);
  auto reverseMaxIndex =
    *std::max_element(reverseIndices.begin(), reverseIndices.end());
  // prefer to remove copies foremost, as it matters more for code size (minus
  // gzip), and improves throughput.
  if (reverseRemovedCopies > removedCopies ||
      (reverseRemovedCopies == removedCopies && reverseMaxIndex < maxIndex)) {
    indices.swap(reverseIndices);
  }
}